

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte bVar2;
  xmlChar xVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  byte *pbVar6;
  unsigned_long uVar7;
  xmlChar *pxVar8;
  startElementSAXFunc p_Var9;
  int iVar10;
  int iVar11;
  int iVar12;
  xmlChar *str2;
  xmlChar **ppxVar13;
  xmlChar **ppxVar14;
  long lVar15;
  xmlChar *attvalue;
  int local_54;
  xmlChar *local_48;
  xmlChar *local_40;
  int local_34;
  
  pxVar4 = ctxt->input;
  pxVar5 = pxVar4->cur;
  if (*pxVar5 == '<') {
    ppxVar14 = ctxt->atts;
    local_54 = ctxt->maxatts;
    pxVar4->col = pxVar4->col + 1;
    pxVar4->cur = pxVar5 + 1;
    if (pxVar5[1] == '\0') {
      xmlParserInputGrow(pxVar4,0xfa);
    }
    local_40 = xmlParseName(ctxt);
    if (local_40 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar10 = 0;
      do {
        pxVar4 = ctxt->input;
        pbVar6 = pxVar4->cur;
        bVar1 = *pbVar6;
        bVar2 = bVar1;
        if (bVar1 == 0x2f) {
          bVar2 = pbVar6[1];
        }
        if ((bVar2 == 0x3e) ||
           (((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20)) ||
            (ctxt->instate == XML_PARSER_EOF)))) break;
        local_34 = pxVar4->id;
        uVar7 = pxVar4->consumed;
        pxVar5 = pxVar4->base;
        str2 = xmlParseAttribute(ctxt,&local_48);
        pxVar8 = local_48;
        if (local_48 == (xmlChar *)0x0 || str2 == (xmlChar *)0x0) {
          if (local_48 != (xmlChar *)0x0) {
LAB_001617d5:
            (*xmlFree)(pxVar8);
          }
LAB_0016183d:
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          pxVar8 = ctxt->input->cur;
          xVar3 = *pxVar8;
          iVar11 = 3;
          if ((xVar3 != '>') && ((xVar3 != '/' || (pxVar8[1] != '>')))) {
            iVar12 = xmlSkipBlankChars(ctxt);
            if (iVar12 == 0) {
              xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"attributes construct error\n");
            }
            pxVar4 = ctxt->input;
            lVar15 = (long)pxVar4->cur - (long)pxVar4->base;
            if ((((pbVar6 + (uVar7 - (long)pxVar5) == (byte *)(pxVar4->consumed + lVar15)) &&
                 (str2 == (xmlChar *)0x0)) && (local_34 == pxVar4->id)) &&
               (local_48 == (xmlChar *)0x0)) {
              xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,
                             "xmlParseStartTag: problem parsing attributes\n");
            }
            else {
              if (((500 < lVar15) && (ctxt->progressive == 0)) &&
                 ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
                xmlSHRINK(ctxt);
              }
              iVar11 = 0;
              if ((ctxt->progressive == 0) &&
                 (iVar11 = 0, (long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                xmlGROW(ctxt);
              }
            }
          }
        }
        else {
          if (0 < iVar10) {
            lVar15 = 0;
            do {
              iVar11 = xmlStrEqual(ppxVar14[lVar15],str2);
              if (iVar11 != 0) {
                xmlErrAttributeDup(ctxt,(xmlChar *)0x0,str2);
                goto LAB_001617d5;
              }
              lVar15 = lVar15 + 2;
            } while ((int)lVar15 < iVar10);
          }
          if (ppxVar14 == (xmlChar **)0x0) {
            ppxVar14 = (xmlChar **)(*xmlMalloc)(0xb0);
            if (ppxVar14 != (xmlChar **)0x0) {
              ctxt->atts = ppxVar14;
              ctxt->maxatts = 0x16;
              local_54 = 0x16;
              goto LAB_00161816;
            }
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxVar8);
            local_54 = 0x16;
            ppxVar14 = (xmlChar **)0x0;
            goto LAB_0016183d;
          }
          if (iVar10 + 4 <= local_54) {
LAB_00161816:
            ppxVar14[iVar10] = str2;
            ppxVar14[(long)iVar10 + 1] = local_48;
            ppxVar14[(long)iVar10 + 2] = (xmlChar *)0x0;
            (ppxVar14 + (long)iVar10 + 2)[1] = (xmlChar *)0x0;
            iVar10 = iVar10 + 2;
            goto LAB_0016183d;
          }
          local_54 = local_54 * 2;
          ppxVar13 = (xmlChar **)(*xmlRealloc)(ppxVar14,(long)local_54 << 3);
          if (ppxVar13 == (xmlChar **)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            iVar11 = 7;
            if (local_48 != (xmlChar *)0x0) {
              (*xmlFree)(local_48);
            }
          }
          else {
            ctxt->atts = ppxVar13;
            ctxt->maxatts = local_54;
            iVar11 = 0;
            ppxVar14 = ppxVar13;
          }
          if (iVar11 == 7) goto LAB_0016183d;
          if (iVar11 == 0) goto LAB_00161816;
        }
      } while (iVar11 == 0);
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (p_Var9 = ctxt->sax->startElement, p_Var9 != (startElementSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        ppxVar13 = (xmlChar **)0x0;
        if (0 < iVar10) {
          ppxVar13 = ppxVar14;
        }
        (*p_Var9)(ctxt->userData,local_40,ppxVar13);
      }
      if (iVar10 < 2 || ppxVar14 == (xmlChar **)0x0) {
        return local_40;
      }
      lVar15 = 1;
      do {
        if (ppxVar14[lVar15] != (xmlChar *)0x0) {
          (*xmlFree)(ppxVar14[lVar15]);
        }
        lVar15 = lVar15 + 2;
      } while ((int)lVar15 < iVar10);
      return local_40;
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (ctxt->instate != XML_PARSER_EOF)) {
        int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;

	attname = xmlParseAttribute(ctxt, &attvalue);
        if ((attname != NULL) && (attvalue != NULL)) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    xmlFree(attvalue);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	} else {
	    if (attvalue != NULL)
		xmlFree(attvalue);
	}

failed:

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
        if ((cons == CUR_CONSUMED) && (id == ctxt->input->id) &&
            (attname == NULL) && (attvalue == NULL)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			   "xmlParseStartTag: problem parsing attributes\n");
	    break;
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}